

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_layout.cpp
# Opt level: O2

spv_result_t
spvtools::val::anon_unknown_3::FunctionScopedInstructions
          (ValidationState_t *_,Instruction *inst,Op opcode)

{
  uint32_t ret_type_id;
  uint32_t id;
  bool bVar1;
  ModuleLayoutSection MVar2;
  spv_result_t sVar3;
  FunctionControlMask function_control;
  uint uVar4;
  Function *pFVar5;
  size_t sVar6;
  char *pcVar7;
  DiagnosticStream local_200;
  
  MVar2 = ValidationState_t::current_layout_section(_);
  if ((MVar2 == kLayoutFunctionDeclarations) &&
     (bVar1 = ValidationState_t::IsOpcodeInCurrentLayoutSection(_,opcode), !bVar1)) {
    ValidationState_t::ProgressToNextLayoutSectionOrder(_);
    bVar1 = ValidationState_t::in_function_body(_);
    if (bVar1) {
      pFVar5 = ValidationState_t::current_function(_);
      sVar3 = val::Function::RegisterSetFunctionDeclType(pFVar5,kFunctionDeclDefinition);
      if (sVar3 != SPV_SUCCESS) {
        return sVar3;
      }
    }
  }
  bVar1 = ValidationState_t::IsOpcodeInCurrentLayoutSection(_,opcode);
  if (!bVar1) {
    ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_LAYOUT,inst);
    pcVar7 = spvOpcodeString(opcode);
    std::operator<<((ostream *)&local_200,pcVar7);
    pcVar7 = " cannot appear in a function declaration";
    goto LAB_0055c814;
  }
  if (opcode == OpLine) {
    return SPV_SUCCESS;
  }
  if ((opcode == OpExtInst) || (opcode == OpExtInstWithForwardRefsKHR)) {
    bVar1 = spvExtInstIsDebugInfo((inst->inst_).ext_inst_type);
    if (bVar1) {
      uVar4 = (inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
              .super__Vector_impl_data._M_start[4];
      if ((inst->inst_).ext_inst_type == SPV_EXT_INST_TYPE_NONSEMANTIC_SHADER_DEBUGINFO_100) {
        if (((uVar4 < 0x1e) && ((0x31800000U >> (uVar4 & 0x1f) & 1) != 0)) ||
           ((uVar4 - 0x65 < 4 && (uVar4 - 0x65 != 1)))) goto LAB_0055cb08;
      }
      else if ((uVar4 < 0x1e) && ((0x31800000U >> (uVar4 & 0x1f) & 1) != 0)) {
LAB_0055cb08:
        bVar1 = ValidationState_t::in_function_body(_);
        if (bVar1) {
          return SPV_SUCCESS;
        }
        ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_LAYOUT,inst);
        std::operator<<((ostream *)&local_200,"DebugScope, DebugNoScope, DebugDeclare, DebugValue ")
        ;
        std::operator<<((ostream *)&local_200,"of debug info extension must appear in a function ");
        pcVar7 = "body";
        goto LAB_0055c814;
      }
      MVar2 = ValidationState_t::current_layout_section(_);
      if ((10 < (int)MVar2) &&
         (MVar2 = ValidationState_t::current_layout_section(_), (int)MVar2 < 0xc)) {
        return SPV_SUCCESS;
      }
      ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_LAYOUT,inst);
      std::operator<<((ostream *)&local_200,"Debug info extension instructions other than ");
      std::operator<<((ostream *)&local_200,"DebugScope, DebugNoScope, DebugDeclare, DebugValue ");
      std::operator<<((ostream *)&local_200,"must appear between section 9 (types, constants, ");
      std::operator<<((ostream *)&local_200,"global variables) and section 10 (function ");
      pcVar7 = "declarations)";
      goto LAB_0055c814;
    }
    bVar1 = spvExtInstIsNonSemantic((inst->inst_).ext_inst_type);
    if (bVar1) {
      MVar2 = ValidationState_t::current_layout_section(_);
      if ((int)MVar2 < 0xb) {
        ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_LAYOUT,inst);
        std::operator<<((ostream *)&local_200,"Non-semantic OpExtInst must not appear before types "
                       );
        pcVar7 = "section";
      }
      else {
        bVar1 = ValidationState_t::in_function_body(_);
        if (!bVar1) {
          return SPV_SUCCESS;
        }
        bVar1 = ValidationState_t::in_block(_);
        if (bVar1) {
          return SPV_SUCCESS;
        }
        ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_LAYOUT,inst);
        pcVar7 = "Non-semantic OpExtInst within function definition must appear in a block";
      }
      goto LAB_0055c814;
    }
  }
  else {
    if (opcode == OpFunctionParameter) {
      bVar1 = ValidationState_t::in_function_body(_);
      if (bVar1) {
        pFVar5 = ValidationState_t::current_function(_);
        sVar6 = val::Function::block_count(pFVar5);
        if (sVar6 == 0) {
          pFVar5 = ValidationState_t::current_function(_);
          sVar3 = val::Function::RegisterFunctionParameter
                            (pFVar5,(inst->inst_).result_id,(inst->inst_).type_id);
LAB_0055cc28:
          if (sVar3 == SPV_SUCCESS) {
            return SPV_SUCCESS;
          }
          return sVar3;
        }
        ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_LAYOUT,inst);
        pcVar7 = "Function parameters must only appear immediately after the function definition";
      }
      else {
        ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_LAYOUT,inst);
        pcVar7 = "Function parameter instructions must be in a function body";
      }
      goto LAB_0055c814;
    }
    if (opcode == OpFunctionEnd) {
      bVar1 = ValidationState_t::in_function_body(_);
      if (bVar1) {
        bVar1 = ValidationState_t::in_block(_);
        if (bVar1) {
          ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_LAYOUT,inst);
          pcVar7 = "Function end cannot be called in blocks";
        }
        else {
          pFVar5 = ValidationState_t::current_function(_);
          sVar6 = val::Function::block_count(pFVar5);
          if ((sVar6 != 0) ||
             (MVar2 = ValidationState_t::current_layout_section(_),
             MVar2 != kLayoutFunctionDefinitions)) {
            MVar2 = ValidationState_t::current_layout_section(_);
            if (MVar2 == kLayoutFunctionDeclarations) {
              pFVar5 = ValidationState_t::current_function(_);
              sVar3 = val::Function::RegisterSetFunctionDeclType(pFVar5,kFunctionDeclDeclaration);
              if (sVar3 != SPV_SUCCESS) {
                return sVar3;
              }
            }
            sVar3 = ValidationState_t::RegisterFunctionEnd(_);
            goto LAB_0055cc28;
          }
          ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_LAYOUT,inst);
          pcVar7 = "Function declarations must appear before function definitions.";
        }
      }
      else {
        ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_LAYOUT,inst);
        pcVar7 = "Function end instructions must be in a function body";
      }
      goto LAB_0055c814;
    }
    if (opcode == OpLabel) {
      bVar1 = ValidationState_t::in_function_body(_);
      if (bVar1) {
        bVar1 = ValidationState_t::in_block(_);
        if (!bVar1) {
          return SPV_SUCCESS;
        }
        ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_LAYOUT,inst);
        pcVar7 = "A block must end with a branch instruction.";
      }
      else {
        ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_LAYOUT,inst);
        pcVar7 = "Label instructions must be in a function body";
      }
      goto LAB_0055c814;
    }
    if (opcode == OpNoLine) {
      return SPV_SUCCESS;
    }
    if (opcode == OpFunction) {
      bVar1 = ValidationState_t::in_function_body(_);
      if (!bVar1) {
        function_control = Instruction::GetOperandAs<spv::FunctionControlMask>(inst,2);
        ret_type_id = (inst->inst_).type_id;
        id = (inst->inst_).result_id;
        uVar4 = Instruction::GetOperandAs<unsigned_int>(inst,3);
        sVar3 = ValidationState_t::RegisterFunction(_,id,ret_type_id,function_control,uVar4);
        if (sVar3 != SPV_SUCCESS) {
          return sVar3;
        }
        MVar2 = ValidationState_t::current_layout_section(_);
        if (MVar2 != kLayoutFunctionDefinitions) {
          return SPV_SUCCESS;
        }
        pFVar5 = ValidationState_t::current_function(_);
        sVar3 = val::Function::RegisterSetFunctionDeclType(pFVar5,kFunctionDeclDefinition);
        goto LAB_0055cc28;
      }
      ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_LAYOUT,inst);
      pcVar7 = "Cannot declare a function in a function body";
      goto LAB_0055c814;
    }
    MVar2 = ValidationState_t::current_layout_section(_);
    if ((MVar2 == kLayoutFunctionDeclarations) &&
       (bVar1 = ValidationState_t::in_function_body(_), bVar1)) {
      ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_LAYOUT,inst);
      pcVar7 = "A function must begin with a label";
      goto LAB_0055c814;
    }
  }
  bVar1 = ValidationState_t::in_block(_);
  if (bVar1) {
    return SPV_SUCCESS;
  }
  ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_LAYOUT,inst);
  pcVar7 = spvOpcodeString(opcode);
  std::operator<<((ostream *)&local_200,pcVar7);
  pcVar7 = " must appear in a block";
LAB_0055c814:
  std::operator<<((ostream *)&local_200,pcVar7);
  DiagnosticStream::~DiagnosticStream(&local_200);
  return local_200.error_;
}

Assistant:

spv_result_t FunctionScopedInstructions(ValidationState_t& _,
                                        const Instruction* inst,
                                        spv::Op opcode) {
  // Make sure we advance into the function definitions when we hit
  // non-function declaration instructions.
  if (_.current_layout_section() == kLayoutFunctionDeclarations &&
      !_.IsOpcodeInCurrentLayoutSection(opcode)) {
    _.ProgressToNextLayoutSectionOrder();

    if (_.in_function_body()) {
      if (auto error = _.current_function().RegisterSetFunctionDeclType(
              FunctionDecl::kFunctionDeclDefinition)) {
        return error;
      }
    }
  }

  if (_.IsOpcodeInCurrentLayoutSection(opcode)) {
    switch (opcode) {
      case spv::Op::OpFunction: {
        if (_.in_function_body()) {
          return _.diag(SPV_ERROR_INVALID_LAYOUT, inst)
                 << "Cannot declare a function in a function body";
        }
        auto control_mask = inst->GetOperandAs<spv::FunctionControlMask>(2);
        if (auto error =
                _.RegisterFunction(inst->id(), inst->type_id(), control_mask,
                                   inst->GetOperandAs<uint32_t>(3)))
          return error;
        if (_.current_layout_section() == kLayoutFunctionDefinitions) {
          if (auto error = _.current_function().RegisterSetFunctionDeclType(
                  FunctionDecl::kFunctionDeclDefinition))
            return error;
        }
      } break;

      case spv::Op::OpFunctionParameter:
        if (_.in_function_body() == false) {
          return _.diag(SPV_ERROR_INVALID_LAYOUT, inst)
                 << "Function parameter instructions must be in a "
                    "function body";
        }
        if (_.current_function().block_count() != 0) {
          return _.diag(SPV_ERROR_INVALID_LAYOUT, inst)
                 << "Function parameters must only appear immediately after "
                    "the function definition";
        }
        if (auto error = _.current_function().RegisterFunctionParameter(
                inst->id(), inst->type_id()))
          return error;
        break;

      case spv::Op::OpFunctionEnd:
        if (_.in_function_body() == false) {
          return _.diag(SPV_ERROR_INVALID_LAYOUT, inst)
                 << "Function end instructions must be in a function body";
        }
        if (_.in_block()) {
          return _.diag(SPV_ERROR_INVALID_LAYOUT, inst)
                 << "Function end cannot be called in blocks";
        }
        if (_.current_function().block_count() == 0 &&
            _.current_layout_section() == kLayoutFunctionDefinitions) {
          return _.diag(SPV_ERROR_INVALID_LAYOUT, inst)
                 << "Function declarations must appear before "
                    "function definitions.";
        }
        if (_.current_layout_section() == kLayoutFunctionDeclarations) {
          if (auto error = _.current_function().RegisterSetFunctionDeclType(
                  FunctionDecl::kFunctionDeclDeclaration))
            return error;
        }
        if (auto error = _.RegisterFunctionEnd()) return error;
        break;

      case spv::Op::OpLine:
      case spv::Op::OpNoLine:
        break;
      case spv::Op::OpLabel:
        // If the label is encountered then the current function is a
        // definition so set the function to a declaration and update the
        // module section
        if (_.in_function_body() == false) {
          return _.diag(SPV_ERROR_INVALID_LAYOUT, inst)
                 << "Label instructions must be in a function body";
        }
        if (_.in_block()) {
          return _.diag(SPV_ERROR_INVALID_LAYOUT, inst)
                 << "A block must end with a branch instruction.";
        }
        break;

      case spv::Op::OpExtInst:
      case spv::Op::OpExtInstWithForwardRefsKHR:
        if (spvExtInstIsDebugInfo(inst->ext_inst_type())) {
          const uint32_t ext_inst_index = inst->word(4);
          bool local_debug_info = false;
          if (inst->ext_inst_type() == SPV_EXT_INST_TYPE_OPENCL_DEBUGINFO_100) {
            const OpenCLDebugInfo100Instructions ext_inst_key =
                OpenCLDebugInfo100Instructions(ext_inst_index);
            if (ext_inst_key == OpenCLDebugInfo100DebugScope ||
                ext_inst_key == OpenCLDebugInfo100DebugNoScope ||
                ext_inst_key == OpenCLDebugInfo100DebugDeclare ||
                ext_inst_key == OpenCLDebugInfo100DebugValue) {
              local_debug_info = true;
            }
          } else if (inst->ext_inst_type() ==
                     SPV_EXT_INST_TYPE_NONSEMANTIC_SHADER_DEBUGINFO_100) {
            const NonSemanticShaderDebugInfo100Instructions ext_inst_key =
                NonSemanticShaderDebugInfo100Instructions(ext_inst_index);
            if (ext_inst_key == NonSemanticShaderDebugInfo100DebugScope ||
                ext_inst_key == NonSemanticShaderDebugInfo100DebugNoScope ||
                ext_inst_key == NonSemanticShaderDebugInfo100DebugDeclare ||
                ext_inst_key == NonSemanticShaderDebugInfo100DebugValue ||
                ext_inst_key == NonSemanticShaderDebugInfo100DebugLine ||
                ext_inst_key == NonSemanticShaderDebugInfo100DebugNoLine ||
                ext_inst_key ==
                    NonSemanticShaderDebugInfo100DebugFunctionDefinition) {
              local_debug_info = true;
            }
          } else {
            const DebugInfoInstructions ext_inst_key =
                DebugInfoInstructions(ext_inst_index);
            if (ext_inst_key == DebugInfoDebugScope ||
                ext_inst_key == DebugInfoDebugNoScope ||
                ext_inst_key == DebugInfoDebugDeclare ||
                ext_inst_key == DebugInfoDebugValue) {
              local_debug_info = true;
            }
          }

          if (local_debug_info) {
            if (_.in_function_body() == false) {
              // DebugScope, DebugNoScope, DebugDeclare, DebugValue must
              // appear in a function body.
              return _.diag(SPV_ERROR_INVALID_LAYOUT, inst)
                     << "DebugScope, DebugNoScope, DebugDeclare, DebugValue "
                     << "of debug info extension must appear in a function "
                     << "body";
            }
          } else {
            // Debug info extinst opcodes other than DebugScope, DebugNoScope,
            // DebugDeclare, DebugValue must be placed between section 9 (types,
            // constants, global variables) and section 10 (function
            // declarations).
            if (_.current_layout_section() < kLayoutTypes ||
                _.current_layout_section() >= kLayoutFunctionDeclarations) {
              return _.diag(SPV_ERROR_INVALID_LAYOUT, inst)
                     << "Debug info extension instructions other than "
                     << "DebugScope, DebugNoScope, DebugDeclare, DebugValue "
                     << "must appear between section 9 (types, constants, "
                     << "global variables) and section 10 (function "
                     << "declarations)";
            }
          }
        } else if (spvExtInstIsNonSemantic(inst->ext_inst_type())) {
          // non-semantic extinst opcodes are allowed beginning in the types
          // section, but must either be placed outside a function declaration,
          // or inside a block.
          if (_.current_layout_section() < kLayoutTypes) {
            return _.diag(SPV_ERROR_INVALID_LAYOUT, inst)
                   << "Non-semantic OpExtInst must not appear before types "
                   << "section";
          } else if (_.in_function_body() && _.in_block() == false) {
            return _.diag(SPV_ERROR_INVALID_LAYOUT, inst)
                   << "Non-semantic OpExtInst within function definition must "
                      "appear in a block";
          }
        } else {
          // otherwise they must be used in a block
          if (_.in_block() == false) {
            return _.diag(SPV_ERROR_INVALID_LAYOUT, inst)
                   << spvOpcodeString(opcode) << " must appear in a block";
          }
        }
        break;

      default:
        if (_.current_layout_section() == kLayoutFunctionDeclarations &&
            _.in_function_body()) {
          return _.diag(SPV_ERROR_INVALID_LAYOUT, inst)
                 << "A function must begin with a label";
        } else {
          if (_.in_block() == false) {
            return _.diag(SPV_ERROR_INVALID_LAYOUT, inst)
                   << spvOpcodeString(opcode) << " must appear in a block";
          }
        }
        break;
    }
  } else {
    return _.diag(SPV_ERROR_INVALID_LAYOUT, inst)
           << spvOpcodeString(opcode)
           << " cannot appear in a function declaration";
  }
  return SPV_SUCCESS;
}